

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgaimage.cpp
# Opt level: O3

bool __thiscall TGAImage::write_tga_file(TGAImage *this,string *filename,bool v_flip,bool rle)

{
  undefined4 uVar1;
  undefined4 uVar2;
  char cVar3;
  bool bVar4;
  ostream *poVar5;
  long lVar6;
  char *pcVar7;
  undefined1 auVar8 [16];
  uint8_t extension_area_ref [4];
  uint8_t developer_area_ref [4];
  uint8_t footer [18];
  ofstream out;
  undefined4 local_260;
  undefined4 local_25c;
  char local_258 [24];
  ulong local_240;
  undefined4 local_238;
  undefined4 local_234;
  char local_230;
  char local_22f;
  long local_228;
  filebuf local_220 [24];
  int aiStack_208 [54];
  ios_base local_130 [264];
  
  local_25c = 0;
  local_260 = 0;
  builtin_strncpy(local_258,"TRUEVISION-XFILE.",0x12);
  std::ofstream::ofstream((string *)&local_228);
  std::ofstream::open((string *)&local_228,(_Ios_Openmode)filename);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"can\'t open file ",0x10);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(filename->_M_dataplus)._M_p,
                        filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    std::ofstream::close();
  }
  else {
    local_238 = 0;
    local_230 = (char)this->bytespp * '\b';
    uVar1 = this->width;
    uVar2 = this->height;
    auVar8._4_4_ = uVar2;
    auVar8._0_4_ = uVar1;
    auVar8._8_8_ = 0;
    auVar8 = pshuflw(auVar8,auVar8,0xe8);
    local_234 = auVar8._0_4_;
    local_240 = (ulong)(byte)(rle * '\b' | this->bytespp == 1) << 0x10 | 0x20000;
    local_22f = !v_flip << 5;
    std::ostream::write((char *)&local_228,(long)&local_240);
    if (*(int *)((long)aiStack_208 + *(long *)(local_228 + -0x18)) == 0) {
      if (rle) {
        bVar4 = unload_rle_data(this,(ofstream *)&local_228);
        if (!bVar4) {
          std::ofstream::close();
          lVar6 = 0x16;
          pcVar7 = "can\'t unload rle data\n";
          goto LAB_001054bf;
        }
LAB_00105585:
        std::ostream::write((char *)&local_228,(long)&local_25c);
        lVar6 = 0x18;
        pcVar7 = "can\'t dump the tga file\n";
        if (*(int *)((long)aiStack_208 + *(long *)(local_228 + -0x18)) == 0) {
          std::ostream::write((char *)&local_228,(long)&local_260);
          if (*(int *)((long)aiStack_208 + *(long *)(local_228 + -0x18)) == 0) {
            std::ostream::write((char *)&local_228,(long)local_258);
            if (*(int *)((long)aiStack_208 + *(long *)(local_228 + -0x18)) == 0) {
              bVar4 = true;
              std::ofstream::close();
              goto LAB_0010561b;
            }
          }
        }
      }
      else {
        std::ostream::write((char *)&local_228,
                            (long)(this->data).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
        if (*(int *)((long)aiStack_208 + *(long *)(local_228 + -0x18)) == 0) goto LAB_00105585;
        lVar6 = 0x16;
        pcVar7 = "can\'t unload raw data\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar7,lVar6);
      std::ofstream::close();
    }
    else {
      std::ofstream::close();
      lVar6 = 0x18;
      pcVar7 = "can\'t dump the tga file\n";
LAB_001054bf:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar7,lVar6);
    }
  }
  bVar4 = false;
LAB_0010561b:
  local_228 = _VTT;
  *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_220);
  std::ios_base::~ios_base(local_130);
  return bVar4;
}

Assistant:

bool TGAImage::write_tga_file(const std::string filename, const bool v_flip, const bool rle) const
{
    std::uint8_t developer_area_ref[4] = {0, 0, 0, 0};
    std::uint8_t extension_area_ref[4] = {0, 0, 0, 0};
    std::uint8_t footer[18] = {'T', 'R', 'U', 'E', 'V', 'I', 'S', 'I', 'O',
                               'N', '-', 'X', 'F', 'I', 'L', 'E', '.', '\0'};
    std::ofstream out;
    out.open(filename, std::ios::binary);
    if (!out.is_open()) {
        std::cerr << "can't open file " << filename << "\n";
        out.close();
        return false;
    }
    TGA_Header header;
    header.bitsperpixel = bytespp << 3;
    header.width = width;
    header.height = height;
    header.datatypecode = (bytespp == GRAYSCALE ? (rle ? 11 : 3) : (rle ? 10 : 2));
    header.imagedescriptor = v_flip ? 0x00 : 0x20;  // top-left or bottom-left origin
    out.write(reinterpret_cast<const char *>(&header), sizeof(header));
    if (!out.good()) {
        out.close();
        std::cerr << "can't dump the tga file\n";
        return false;
    }
    if (!rle) {
        out.write(reinterpret_cast<const char *>(data.data()), width * height * bytespp);
        if (!out.good()) {
            std::cerr << "can't unload raw data\n";
            out.close();
            return false;
        }
    } else {
        if (!unload_rle_data(out)) {
            out.close();
            std::cerr << "can't unload rle data\n";
            return false;
        }
    }
    out.write(reinterpret_cast<const char *>(developer_area_ref), sizeof(developer_area_ref));
    if (!out.good()) {
        std::cerr << "can't dump the tga file\n";
        out.close();
        return false;
    }
    out.write(reinterpret_cast<const char *>(extension_area_ref), sizeof(extension_area_ref));
    if (!out.good()) {
        std::cerr << "can't dump the tga file\n";
        out.close();
        return false;
    }
    out.write(reinterpret_cast<const char *>(footer), sizeof(footer));
    if (!out.good()) {
        std::cerr << "can't dump the tga file\n";
        out.close();
        return false;
    }
    out.close();
    return true;
}